

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplicationPrivate::notifyWindowIconChanged(QApplicationPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  QWindow *local_90;
  QList<QWindow_*> local_88;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,ApplicationWindowIconChange);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  puVar3 = puStack_60;
  if (local_58 != (undefined1 *)0x0) {
    lVar2 = (long)local_58 << 3;
    lVar1 = 0;
    do {
      this_00 = *(QWidget **)(puVar3 + lVar1);
      local_90 = QWidget::windowHandle(this_00);
      QtPrivate::sequential_erase_one<QList<QWindow*>,QWindow*>(&local_88,&local_90);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
      lVar1 = lVar1 + 8;
    } while (lVar2 != lVar1);
  }
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    puVar3 = (undefined1 *)0x0;
    do {
      QCoreApplication::sendEvent((QObject *)local_88.d.ptr[(long)puVar3],(QEvent *)&local_48);
      puVar3 = puVar3 + 1;
    } while (puVar3 < (ulong)local_88.d.size);
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,8,0x10);
    }
  }
  QEvent::~QEvent((QEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeOne(w->windowHandle());
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i)
        QCoreApplication::sendEvent(windowList.at(i), &ev);
}